

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

int __thiscall
ON_Extrusion::GetProfileKinkParameters
          (ON_Extrusion *this,int profile_index,ON_SimpleArray<double> *profile_kink_parameters_ptr)

{
  bool bVar1;
  int local_4c;
  double dStack_48;
  int count;
  double t;
  double t1;
  double t0;
  ON_Curve *profile2d;
  ON_SimpleArray<double> *profile_kink_parameters_ptr_local;
  ON_Extrusion *pOStack_18;
  int profile_index_local;
  ON_Extrusion *this_local;
  
  profile2d = (ON_Curve *)profile_kink_parameters_ptr;
  profile_kink_parameters_ptr_local._4_4_ = profile_index;
  pOStack_18 = this;
  t0 = (double)Profile(this,profile_index);
  if ((ON_Curve *)t0 == (ON_Curve *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    t1 = -1.23432101234321e+308;
    t = -1.23432101234321e+308;
    bVar1 = ON_Curve::GetDomain((ON_Curve *)t0,&t1,&t);
    if (bVar1) {
      bVar1 = ON_IsValid(t1);
      if ((!bVar1) || (t <= t1)) {
        this_local._4_4_ = 0;
      }
      else {
        local_4c = 0;
        while (bVar1 = GetNextProfileSegmentDiscontinuity
                                 ((ON_Curve *)t0,t1,t,&stack0xffffffffffffffb8), bVar1) {
          if ((t1 < dStack_48) && (dStack_48 < t)) {
            if (profile2d != (ON_Curve *)0x0) {
              ON_SimpleArray<double>::Append
                        ((ON_SimpleArray<double> *)profile2d,&stack0xffffffffffffffb8);
            }
            t1 = dStack_48;
            local_4c = local_4c + 1;
          }
        }
        this_local._4_4_ = local_4c;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_Extrusion::GetProfileKinkParameters( int profile_index, ON_SimpleArray<double>* profile_kink_parameters_ptr ) const
{
  const ON_Curve* profile2d = Profile(profile_index);
  if ( 0 == profile2d )
    return 0;
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  double t;
  if ( !profile2d->GetDomain(&t0,&t1) )
    return 0;
  if ( !ON_IsValid(t0) || !(t0 < t1) )
    return 0;
  int count = 0;
  while ( GetNextProfileSegmentDiscontinuity( profile2d, t0,t1, &t) )
  {
    if ( t0 < t && t < t1 )
    {
      if ( nullptr != profile_kink_parameters_ptr )
      {
        profile_kink_parameters_ptr->Append(t);
      }
      t0 = t;
      count++;
    }
  }
  return count;
}